

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_a4b191::TGlslangToSpvTraverser::~TGlslangToSpvTraverser
          (TGlslangToSpvTraverser *this)

{
  long lVar1;
  
  (this->super_TIntermTraverser)._vptr_TIntermTraverser =
       (_func_int **)&PTR__TGlslangToSpvTraverser_0089eff0;
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->idToQCOMDecorations)._M_h);
  lVar1 = 0xd70;
  do {
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_glslang::TIntermSymbol_*>,_std::allocator<std::pair<const_unsigned_int,_glslang::TIntermSymbol_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_glslang::TIntermSymbol_*>,_std::allocator<std::pair<const_unsigned_int,_glslang::TIntermSymbol_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)((long)&(this->super_TIntermTraverser)._vptr_TIntermTraverser + lVar1));
    lVar1 = lVar1 + -0x38;
  } while (lVar1 != 0xc90);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->forceType)._M_h);
  std::
  _Rb_tree<const_glslang::TType_*,_std::pair<const_glslang::TType_*const,_unsigned_int>,_std::_Select1st<std::pair<const_glslang::TType_*const,_unsigned_int>_>,_std::less<const_glslang::TType_*>,_std::allocator<std::pair<const_glslang::TType_*const,_unsigned_int>_>_>
  ::~_Rb_tree(&(this->forwardPointers)._M_t);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_glslang::TIntermSymbol_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_glslang::TIntermSymbol_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->counterOriginator)._M_h);
  std::_Deque_base<bool,_std::allocator<bool>_>::~_Deque_base
            ((_Deque_base<bool,_std::allocator<bool>_> *)&this->breakForLoop);
  std::
  _Hashtable<const_glslang::TVector<glslang::TTypeLoc>_*,_std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_long_long>,_std::allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_long_long>_>,_std::__detail::_Select1st,_std::equal_to<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::hash<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->glslangTypeToIdMap)._M_h);
  std::
  _Hashtable<long_long,_std::pair<const_long_long,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_long_long,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->memberRemapper)._M_h);
  lVar1 = 0xb28;
  do {
    std::
    _Hashtable<const_glslang::TVector<glslang::TTypeLoc>_*,_std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_unsigned_int>,_std::allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::hash<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable((_Hashtable<const_glslang::TVector<glslang::TTypeLoc>_*,_std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_unsigned_int>,_std::allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::hash<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)((long)&(this->super_TIntermTraverser)._vptr_TIntermTraverser + lVar1));
    lVar1 = lVar1 + -0x38;
  } while (lVar1 != 0x738);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spv::Function_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spv::Function_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->functionMap)._M_h);
  std::
  _Hashtable<long_long,_long_long,_std::allocator<long_long>,_std::__detail::_Identity,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&(this->rValueParameters)._M_h);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->builtInVariableIds)._M_h);
  std::
  _Hashtable<long_long,_std::pair<const_long_long,_unsigned_int>,_std::allocator<std::pair<const_long_long,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->symbolValues)._M_h);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->extBuiltinMap)._M_h);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&(this->iOSet)._M_t);
  spv::Builder::~Builder(&this->builder);
  (this->super_TIntermTraverser)._vptr_TIntermTraverser =
       (_func_int **)&PTR__TIntermTraverser_0089af70;
  return;
}

Assistant:

virtual ~TGlslangToSpvTraverser() { }